

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record.hpp
# Opt level: O3

void __thiscall Excel::Record::~Record(Record *this)

{
  pointer piVar1;
  
  piVar1 = (this->m_borders).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1,(long)(this->m_borders).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)piVar1);
  }
  (this->m_stream).super_Stream._vptr_Stream = (_func_int **)&PTR__RecordSubstream_0012cb30;
  std::__cxx11::stringstream::~stringstream((stringstream *)&(this->m_stream).m_stream);
  std::ios_base::~ios_base((ios_base *)&(this->m_stream).field_0x90);
  return;
}

Assistant:

inline
Record::~Record()
{
}